

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  undefined8 this_00;
  bool bVar1;
  value_type this_01;
  DescriptorStringView psVar2;
  FieldGenerator *this_02;
  char *pcVar3;
  undefined1 in_R8B;
  Iterator IVar4;
  Iterator IVar5;
  undefined1 auVar6 [16];
  string_view input;
  string_view s;
  string_view s_00;
  Sub *local_2a0;
  string local_268;
  undefined1 local_248 [16];
  string local_238;
  undefined1 local_218 [16];
  string local_208;
  value_type_conflict local_1e8;
  value_type_conflict field;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  allocator<char> local_199;
  string local_198;
  Sub *local_178;
  Sub local_170;
  iterator local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  undefined1 local_98 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Formatter format;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  undefined8 uStack_18;
  int i;
  Printer *p_local;
  MessageGenerator *this_local;
  
  __range3._4_4_ = 0;
  uStack_18 = p;
  p_local = (Printer *)this;
  __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
  IVar4 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
  __begin3._0_8_ = IVar4.descriptor;
  __end3.descriptor._0_4_ = IVar4.idx;
  IVar4 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
  __end3._0_8_ = IVar4.descriptor;
  oneof._0_4_ = IVar4.idx;
  while( true ) {
    bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof);
    if (!bVar1) break;
    this_01 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
    Formatter::Formatter((Formatter *)(v.storage_.callback_buffer_ + 8),(Printer *)uStack_18);
    this_00 = uStack_18;
    local_178 = &local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"oneofname",&local_199);
    psVar2 = OneofDescriptor::name_abi_cxx11_(this_01);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_170,&local_198,psVar2);
    local_b8 = &local_170;
    local_b0 = 1;
    v_00._M_len = 1;
    v_00._M_array = local_b8;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_a8._M_local_buf,v_00);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_98,(Printer *)this_00,
               (Span<const_google::protobuf::io::Printer::Sub>)local_a8);
    local_2a0 = (Sub *)&local_b8;
    do {
      local_2a0 = local_2a0 + -1;
      io::Printer::Sub::~Sub(local_2a0);
    } while (local_2a0 != &local_170);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"switch ($oneofname$_case()) {\n");
    Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
    __begin4.descriptor =
         (OneofDescriptor *)
         protobuf::internal::FieldRange<google::protobuf::OneofDescriptor>(this_01);
    IVar5 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __begin4._0_8_ = IVar5.descriptor;
    __end4.descriptor._0_4_ = IVar5.idx;
    IVar5 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __end4._0_8_ = IVar5.descriptor;
    field._0_4_ = IVar5.idx;
    pcVar3 = (char *)(ulong)(uint)field;
    while( true ) {
      bVar1 = protobuf::internal::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&field);
      if (!bVar1) break;
      local_1e8 = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
                  operator*((Iterator *)&__end4.descriptor);
      psVar2 = FieldDescriptor::name_abi_cxx11_(local_1e8);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
      input._M_len = auVar6._8_8_;
      input._M_str = (char *)0x1;
      pcVar3 = (char *)0x1;
      local_218 = auVar6;
      UnderscoresToCamelCase_abi_cxx11_(&local_208,auVar6._0_8_,input,(bool)in_R8B);
      Formatter::operator()
                ((Formatter *)(v.storage_.callback_buffer_ + 8),"case k$1$: {\n",&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      Formatter::Indent((Formatter *)(v.storage_.callback_buffer_ + 8));
      bVar1 = IsStringOrMessage(local_1e8);
      if (bVar1) {
        this_02 = FieldGeneratorTable::get(&this->field_generators_,local_1e8);
        FieldGenerator::GenerateClearingCode(this_02,(Printer *)uStack_18);
      }
      else {
        Formatter::operator()<>
                  ((Formatter *)(v.storage_.callback_buffer_ + 8),"// No need to clear\n");
      }
      Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"break;\n");
      Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
      Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"}\n");
      protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                ((Iterator *)&__end4.descriptor);
    }
    psVar2 = OneofDescriptor::name_abi_cxx11_(this_01);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    s._M_len = auVar6._8_8_;
    s._M_str = pcVar3;
    local_248 = auVar6;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_238,auVar6._0_8_,s);
    Formatter::operator()
              ((Formatter *)(v.storage_.callback_buffer_ + 8),"case $1$_NOT_SET: {\n  break;\n}\n",
               &local_238);
    std::__cxx11::string::~string((string *)&local_238);
    Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
    psVar2 = OneofDescriptor::name_abi_cxx11_(this_01);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    s_00._M_len = auVar6._8_8_;
    s_00._M_str = pcVar3;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_268,auVar6._0_8_,s_00);
    Formatter::operator()
              ((Formatter *)(v.storage_.callback_buffer_ + 8),
               "}\n$oneof_case$[$1$] = $2$_NOT_SET;\n",(int *)((long)&__range3 + 4),&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    Formatter::Outdent((Formatter *)(v.storage_.callback_buffer_ + 8));
    Formatter::operator()<>((Formatter *)(v.storage_.callback_buffer_ + 8),"}\n\n");
    __range3._4_4_ = __range3._4_4_ + 1;
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_98);
    Formatter::~Formatter((Formatter *)(v.storage_.callback_buffer_ + 8));
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* p) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(p);
    auto v = p->WithVars({{"oneofname", oneof->name()}});

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("$pbi$::TSanWrite(&_impl_);\n");
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(p);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "$oneof_case$[$1$] = $2$_NOT_SET;\n",
        i, absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    ++i;
  }
}